

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O3

void free_atom_server(atom_server as)

{
  undefined8 *__ptr;
  Tcl_HashEntry *pTVar1;
  Tcl_HashSearch search;
  Tcl_HashSearch TStack_38;
  
  pTVar1 = Tcl_FirstHashEntry(&as->string_hash_table,&TStack_38);
  while (pTVar1 != (Tcl_HashEntry *)0x0) {
    __ptr = (undefined8 *)pTVar1->clientData;
    free((void *)*__ptr);
    free(__ptr);
    pTVar1 = Tcl_NextHashEntry(&TStack_38);
  }
  Tcl_DeleteHashTable(&as->string_hash_table);
  Tcl_DeleteHashTable(&as->value_hash_table);
  free(as);
  return;
}

Assistant:

void
free_atom_server(atom_server as)
{
  Tcl_HashSearch search;
  Tcl_HashEntry * entry = Tcl_FirstHashEntry(&as->string_hash_table, &search);
  while (entry) {
    send_get_atom_msg_ptr stored;
    stored = (send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
    free(stored->atom_string);
    free(stored);
    entry = Tcl_NextHashEntry(&search);
  }
  Tcl_DeleteHashTable(&as->string_hash_table);
  Tcl_DeleteHashTable(&as->value_hash_table);
  free(as);
}